

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_util.cc
# Opt level: O3

void google::protobuf::internal::RepeatedFieldHelper<9>::
     Serialize<google::protobuf::internal::ArrayOutput>
               (void *field,FieldMetadata *md,ArrayOutput *output)

{
  uint8_t *puVar1;
  long lVar2;
  RepeatedPtrFieldBase *array;
  long lVar3;
  uint32_t local_2c;
  
  if (0 < *(int *)((long)field + 8)) {
    lVar3 = 0;
    do {
      local_2c = md->tag;
      OutputHelper<google::protobuf::internal::ArrayOutput,_13>::Serialize(&local_2c,output);
      lVar2 = *(long *)((long)field + 0x10) + 8;
      if (*(long *)((long)field + 0x10) == 0) {
        lVar2 = 0;
      }
      puVar1 = io::CodedOutputStream::WriteStringWithSizeToArray
                         (*(string **)(lVar2 + lVar3 * 8),output->ptr);
      output->ptr = puVar1;
      lVar3 = lVar3 + 1;
    } while (lVar3 < *(int *)((long)field + 8));
  }
  return;
}

Assistant:

static void Serialize(const void* field, const FieldMetadata& md, O* output) {
    const internal::RepeatedPtrFieldBase& array =
        Get<internal::RepeatedPtrFieldBase>(field);
    for (int i = 0; i < AccessorHelper::Size(array); i++) {
      WriteTagTo(md.tag, output);
      SerializeTo<WireFormatLite::TYPE_STRING>(AccessorHelper::Get(array, i),
                                               output);
    }
  }